

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

char * cmCMakePresetsGraph::ResultToString(ReadFileResult result)

{
  char *pcStack_10;
  ReadFileResult result_local;
  
  switch(result) {
  case READ_OK:
    pcStack_10 = "OK";
    break;
  case FILE_NOT_FOUND:
    pcStack_10 = "File not found";
    break;
  case JSON_PARSE_ERROR:
    pcStack_10 = "JSON parse error";
    break;
  case INVALID_ROOT:
    pcStack_10 = "Invalid root object";
    break;
  case NO_VERSION:
    pcStack_10 = "No \"version\" field";
    break;
  case INVALID_VERSION:
    pcStack_10 = "Invalid \"version\" field";
    break;
  case UNRECOGNIZED_VERSION:
    pcStack_10 = "Unrecognized \"version\" field";
    break;
  case INVALID_CMAKE_VERSION:
    pcStack_10 = "Invalid \"cmakeMinimumRequired\" field";
    break;
  case UNRECOGNIZED_CMAKE_VERSION:
    pcStack_10 = "\"cmakeMinimumRequired\" version too new";
    break;
  case INVALID_PRESETS:
    pcStack_10 = "Invalid \"configurePresets\" field";
    break;
  case INVALID_PRESET:
    pcStack_10 = "Invalid preset";
    break;
  case INVALID_VARIABLE:
    pcStack_10 = "Invalid CMake variable definition";
    break;
  case DUPLICATE_PRESETS:
    pcStack_10 = "Duplicate presets";
    break;
  case CYCLIC_PRESET_INHERITANCE:
    pcStack_10 = "Cyclic preset inheritance";
    break;
  case INHERITED_PRESET_UNREACHABLE_FROM_FILE:
    pcStack_10 = "Inherited preset is unreachable from preset\'s file";
    break;
  case CONFIGURE_PRESET_UNREACHABLE_FROM_FILE:
    pcStack_10 = "Configure preset is unreachable from preset\'s file";
    break;
  case INVALID_MACRO_EXPANSION:
    pcStack_10 = "Invalid macro expansion";
    break;
  case BUILD_TEST_PRESETS_UNSUPPORTED:
    pcStack_10 = "File version must be 2 or higher for build and test preset support.";
    break;
  case PACKAGE_PRESETS_UNSUPPORTED:
    pcStack_10 = "File version must be 6 or higher for package preset support";
    break;
  case WORKFLOW_PRESETS_UNSUPPORTED:
    pcStack_10 = "File version must be 6 or higher for workflow preset support";
    break;
  case INCLUDE_UNSUPPORTED:
    pcStack_10 = "File version must be 4 or higher for include support";
    break;
  case INVALID_INCLUDE:
    pcStack_10 = "Invalid \"include\" field";
    break;
  case INVALID_CONFIGURE_PRESET:
    pcStack_10 = "Invalid \"configurePreset\" field";
    break;
  case INSTALL_PREFIX_UNSUPPORTED:
    pcStack_10 = "File version must be 3 or higher for installDir preset support.";
    break;
  case INVALID_CONDITION:
    pcStack_10 = "Invalid preset condition";
    break;
  case CONDITION_UNSUPPORTED:
    pcStack_10 = "File version must be 3 or higher for condition support";
    break;
  case TOOLCHAIN_FILE_UNSUPPORTED:
    pcStack_10 = "File version must be 3 or higher for toolchainFile preset support.";
    break;
  case CYCLIC_INCLUDE:
    pcStack_10 = "Cyclic include among preset files";
    break;
  case TEST_OUTPUT_TRUNCATION_UNSUPPORTED:
    pcStack_10 = "File version must be 5 or higher for testOutputTruncation preset support.";
    break;
  case INVALID_WORKFLOW_STEPS:
    pcStack_10 = "Invalid workflow steps";
    break;
  case WORKFLOW_STEP_UNREACHABLE_FROM_FILE:
    pcStack_10 = "Workflow step is unreachable from preset\'s file";
    break;
  case CTEST_JUNIT_UNSUPPORTED:
    pcStack_10 = "File version must be 6 or higher for CTest JUnit output support";
    break;
  default:
    pcStack_10 = "Unknown error";
  }
  return pcStack_10;
}

Assistant:

const char* cmCMakePresetsGraph::ResultToString(ReadFileResult result)
{
  switch (result) {
    case ReadFileResult::READ_OK:
      return "OK";
    case ReadFileResult::FILE_NOT_FOUND:
      return "File not found";
    case ReadFileResult::JSON_PARSE_ERROR:
      return "JSON parse error";
    case ReadFileResult::INVALID_ROOT:
      return "Invalid root object";
    case ReadFileResult::NO_VERSION:
      return "No \"version\" field";
    case ReadFileResult::INVALID_VERSION:
      return "Invalid \"version\" field";
    case ReadFileResult::UNRECOGNIZED_VERSION:
      return "Unrecognized \"version\" field";
    case ReadFileResult::INVALID_CMAKE_VERSION:
      return "Invalid \"cmakeMinimumRequired\" field";
    case ReadFileResult::UNRECOGNIZED_CMAKE_VERSION:
      return "\"cmakeMinimumRequired\" version too new";
    case ReadFileResult::INVALID_PRESETS:
      return "Invalid \"configurePresets\" field";
    case ReadFileResult::INVALID_PRESET:
      return "Invalid preset";
    case ReadFileResult::INVALID_VARIABLE:
      return "Invalid CMake variable definition";
    case ReadFileResult::DUPLICATE_PRESETS:
      return "Duplicate presets";
    case ReadFileResult::CYCLIC_PRESET_INHERITANCE:
      return "Cyclic preset inheritance";
    case ReadFileResult::INHERITED_PRESET_UNREACHABLE_FROM_FILE:
      return "Inherited preset is unreachable from preset's file";
    case ReadFileResult::CONFIGURE_PRESET_UNREACHABLE_FROM_FILE:
      return "Configure preset is unreachable from preset's file";
    case ReadFileResult::INVALID_MACRO_EXPANSION:
      return "Invalid macro expansion";
    case ReadFileResult::BUILD_TEST_PRESETS_UNSUPPORTED:
      return "File version must be 2 or higher for build and test preset "
             "support.";
    case ReadFileResult::PACKAGE_PRESETS_UNSUPPORTED:
      return "File version must be 6 or higher for package preset support";
    case ReadFileResult::WORKFLOW_PRESETS_UNSUPPORTED:
      return "File version must be 6 or higher for workflow preset support";
    case ReadFileResult::INCLUDE_UNSUPPORTED:
      return "File version must be 4 or higher for include support";
    case ReadFileResult::INVALID_INCLUDE:
      return "Invalid \"include\" field";
    case ReadFileResult::INVALID_CONFIGURE_PRESET:
      return "Invalid \"configurePreset\" field";
    case ReadFileResult::INSTALL_PREFIX_UNSUPPORTED:
      return "File version must be 3 or higher for installDir preset "
             "support.";
    case ReadFileResult::INVALID_CONDITION:
      return "Invalid preset condition";
    case ReadFileResult::CONDITION_UNSUPPORTED:
      return "File version must be 3 or higher for condition support";
    case ReadFileResult::TOOLCHAIN_FILE_UNSUPPORTED:
      return "File version must be 3 or higher for toolchainFile preset "
             "support.";
    case ReadFileResult::CYCLIC_INCLUDE:
      return "Cyclic include among preset files";
    case ReadFileResult::TEST_OUTPUT_TRUNCATION_UNSUPPORTED:
      return "File version must be 5 or higher for testOutputTruncation "
             "preset support.";
    case ReadFileResult::INVALID_WORKFLOW_STEPS:
      return "Invalid workflow steps";
    case ReadFileResult::WORKFLOW_STEP_UNREACHABLE_FROM_FILE:
      return "Workflow step is unreachable from preset's file";
    case ReadFileResult::CTEST_JUNIT_UNSUPPORTED:
      return "File version must be 6 or higher for CTest JUnit output support";
  }

  return "Unknown error";
}